

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winmakefile.cpp
# Opt level: O2

void __thiscall Win32MakefileGenerator::writeIncPart(Win32MakefileGenerator *this,QTextStream *t)

{
  QMakeProject *this_00;
  ProStringList *pPVar1;
  QTextStream *pQVar2;
  int i;
  ulong uVar3;
  long lVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_a0;
  QArrayDataPointer<char16_t> local_88;
  QRegularExpression local_70 [8];
  QArrayDataPointer<char16_t> local_68 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QTextStream::operator<<(t,"INCPATH       = ");
  this_00 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)local_68,"INCLUDEPATH");
  pPVar1 = QMakeEvaluator::valuesRef(&this_00->super_QMakeEvaluator,(ProKey *)local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(local_68);
  lVar4 = 0;
  for (uVar3 = 0; uVar3 < (ulong)(pPVar1->super_QList<ProString>).d.size; uVar3 = uVar3 + 1) {
    local_68[0].size = -0x5555555555555556;
    local_68[0].d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_68[0].ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    ProString::toQString
              ((QString *)local_68,
               (ProString *)
               ((long)&(((pPVar1->super_QList<ProString>).d.ptr)->m_string).d.d + lVar4));
    QString::QString((QString *)&local_88,"\\\\$");
    QRegularExpression::QRegularExpression(local_70,&local_88,0);
    QString::QString((QString *)&local_a0,"");
    QString::replace((QRegularExpression *)local_68,(QString *)local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
    QRegularExpression::~QRegularExpression(local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
    if (local_68[0].size != 0) {
      pQVar2 = (QTextStream *)QTextStream::operator<<(t,"-I");
      (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0xc])
                (&local_88,this,local_68);
      pQVar2 = (QTextStream *)QTextStream::operator<<(pQVar2,(QString *)&local_88);
      QTextStream::operator<<(pQVar2,' ');
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(local_68);
    lVar4 = lVar4 + 0x30;
  }
  Qt::endl(t);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Win32MakefileGenerator::writeIncPart(QTextStream &t)
{
    t << "INCPATH       = ";

    const ProStringList &incs = project->values("INCLUDEPATH");
    for(int i = 0; i < incs.size(); ++i) {
        QString inc = incs.at(i).toQString();
        inc.replace(QRegularExpression("\\\\$"), "");
        if(!inc.isEmpty())
            t << "-I" << escapeFilePath(inc) << ' ';
    }
    t << Qt::endl;
}